

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool __thiscall argo::json::string_equal(json *this,json *other)

{
  __type _Var1;
  json_exception *this_00;
  
  if ((other->m_raw_value)._M_string_length == 0 && (this->m_raw_value)._M_string_length == 0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(this->m_value).u_object,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(other->m_value).u_object);
    return _Var1;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_exception::json_exception(this_00,cant_compare_raw_e);
  __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
}

Assistant:

bool json::string_equal(const json &other) const
{
    if (m_raw_value.size() == 0 && other.m_raw_value.size() == 0)
    {
        return m_value.u_string == other.m_value.u_string;
    }
    else
    {
        throw json_exception(json_exception::cant_compare_raw_e);
    }
}